

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

intptr_t fio_socket(char *address,char *port,uint8_t server)

{
  size_t __n;
  undefined1 *puVar1;
  undefined1 uVar2;
  char cVar3;
  fio_data_s *pfVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int64_t iVar10;
  int *piVar11;
  size_t sVar12;
  undefined7 in_register_00000011;
  addrinfo *paVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  addrinfo *addrinfo;
  int optval;
  char *pos;
  addrinfo *local_d0;
  timespec local_c8;
  char *local_b8;
  undefined4 local_ac;
  addrinfo local_a8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  local_ac = (undefined4)CONCAT71(in_register_00000011,server);
  if (port == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    local_a8._0_8_ = port;
    iVar10 = fio_atol((char **)&local_a8);
    cVar3 = *(char *)local_a8._0_8_;
    pcVar14 = port;
    if (cVar3 == '\0') {
      if (((iVar10 < 1) && (pcVar14 = (char *)0x0, iVar10 < -1)) && (2 < FIO_LOG_LEVEL)) {
        FIO_LOG2STDERR("WARNING: (fio_socket) negative port number %s is ignored.",port);
        pcVar14 = (char *)0x0;
      }
    }
    else {
      if (1 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("ERROR: (fio_socket) port %s is not a number.",port);
      }
      piVar11 = __errno_location();
      *piVar11 = 0x16;
    }
    if (cVar3 != '\0') {
      return 0xffffffffffffffff;
    }
  }
  if (address == (char *)0x0 && pcVar14 == (char *)0x0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (fio_socket) both address and port are missing or invalid.");
    }
    piVar11 = __errno_location();
    *piVar11 = 0x16;
    uVar15 = 0xffffffffffffffff;
  }
  else {
    piVar11 = __errno_location();
    if (pcVar14 == (char *)0x0) {
      do {
        *piVar11 = 0;
        uStack_48 = 0;
        uStack_42 = 0;
        uStack_58 = 0;
        uStack_50 = 0;
        local_4a = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_a8.ai_canonname = (char *)0x0;
        local_a8.ai_next = (addrinfo *)0x0;
        local_a8.ai_addrlen = 0;
        local_a8._20_4_ = 0;
        local_a8.ai_addr = (sockaddr *)0x0;
        local_a8._0_8_ = (char *)0x0;
        local_a8._8_8_ = 0;
        sVar12 = strlen(address);
        if (sVar12 < 0x6c) {
          local_a8.ai_flags._0_2_ = 1;
          __n = sVar12 + 1;
          memcpy((undefined8 *)((long)&local_a8 + 2U),address,__n);
          iVar5 = socket(1,1,0);
          uVar15 = 0xffffffffffffffff;
          if (iVar5 != -1) {
            uVar8 = fcntl(iVar5,3,0);
            uVar6 = uVar8 | 0x80800;
            if (uVar8 == 0xffffffff) {
              uVar6 = 0x80800;
            }
            iVar9 = fcntl(iVar5,4,(ulong)uVar6);
            if (iVar9 != -1) {
              if ((char)local_ac == '\0') {
                iVar9 = connect(iVar5,(sockaddr *)&local_a8,0x6e);
                if ((iVar9 != -1) || (*piVar11 == 0x73)) goto LAB_00107f35;
              }
              else {
                unlink((char *)((long)&local_a8 + 2U));
                iVar9 = bind(iVar5,(sockaddr *)&local_a8,0x6e);
                if ((iVar9 != -1) && (iVar9 = listen(iVar5,0x1000), -1 < iVar9)) {
                  fchmod(iVar5,0x1ff);
LAB_00107f35:
                  pfVar4 = fio_data;
                  lVar16 = (long)iVar5 * 0xa8;
                  LOCK();
                  pcVar14 = (char *)((long)fio_data + lVar16 + 0x6c);
                  cVar3 = *pcVar14;
                  *pcVar14 = '\x01';
                  UNLOCK();
                  local_b8 = (char *)__n;
                  local_c8.tv_sec._0_1_ = cVar3;
                  if (cVar3 != '\0') {
                    pcVar14 = (char *)((long)pfVar4 + lVar16 + 0x6c);
                    do {
                      local_c8.tv_sec = 0;
                      local_c8.tv_nsec = 1;
                      nanosleep(&local_c8,(timespec *)0x0);
                      LOCK();
                      cVar3 = *pcVar14;
                      *pcVar14 = '\x01';
                      UNLOCK();
                      local_c8.tv_sec._0_1_ = cVar3;
                    } while (cVar3 != '\0');
                  }
                  fio_clear_fd((long)iVar5,'\x01');
                  LOCK();
                  puVar1 = (undefined1 *)((long)fio_data + lVar16 + 0x6c);
                  uVar2 = *puVar1;
                  *puVar1 = 0;
                  pfVar4 = fio_data;
                  UNLOCK();
                  local_c8.tv_sec = CONCAT71(local_c8.tv_sec._1_7_,uVar2);
                  if (sVar12 < 0x30) {
                    memcpy((void *)((long)fio_data + lVar16 + 0x72),address,(size_t)local_b8);
                    *(char *)((long)pfVar4 + lVar16 + 0x71) = (char)sVar12;
                  }
                  uVar15 = (ulong)CONCAT41(iVar5,*(undefined1 *)((long)fio_data + lVar16 + 0x6d));
                  goto LAB_00108008;
                }
              }
            }
            close(iVar5);
          }
        }
        else {
          if (1 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR("ERROR: (fio_unix_socket) address too long (%zu bytes > %zu bytes).",
                           sVar12,0x6b);
          }
          *piVar11 = 0x24;
          uVar15 = 0xffffffffffffffff;
        }
LAB_00108008:
      } while (*piVar11 == 4);
    }
    else {
      local_b8 = pcVar14;
      do {
        *piVar11 = 0;
        local_a8.ai_canonname = (char *)0x0;
        local_a8.ai_next = (addrinfo *)0x0;
        local_a8.ai_addrlen = 0;
        local_a8._20_4_ = 0;
        local_a8.ai_addr = (sockaddr *)0x0;
        local_a8._8_8_ = 1;
        local_a8._0_8_ = &DAT_00000001;
        iVar5 = getaddrinfo(address,pcVar14,&local_a8,&local_d0);
        uVar15 = 0xffffffffffffffff;
        if (iVar5 == 0) {
          uVar6 = socket(local_d0->ai_family,local_d0->ai_socktype,local_d0->ai_protocol);
          if ((int)uVar6 < 1) {
            freeaddrinfo(local_d0);
          }
          else {
            uVar7 = fcntl(uVar6,3,0);
            uVar8 = uVar7 | 0x80800;
            if (uVar7 == 0xffffffff) {
              uVar8 = 0x80800;
            }
            iVar5 = fcntl(uVar6,4,(ulong)uVar8);
            if (iVar5 < 0) {
LAB_00107c13:
              uVar15 = 0xffffffffffffffff;
              freeaddrinfo(local_d0);
              close(uVar6);
            }
            else if ((char)local_ac == '\0') {
              local_c8.tv_sec = CONCAT44(local_c8.tv_sec._4_4_,1);
              setsockopt(uVar6,6,1,&local_c8,4);
              *piVar11 = 0;
              iVar5 = 5;
              bVar17 = local_d0 == (addrinfo *)0x0;
              paVar13 = local_d0;
              if (!bVar17) {
                do {
                  iVar5 = connect(uVar6,paVar13->ai_addr,paVar13->ai_addrlen);
                  if (iVar5 == 0) {
                    iVar5 = 8;
                    goto LAB_00107ccc;
                  }
                  if (*piVar11 == 0x73) {
                    iVar5 = 8;
                    goto LAB_00107ccc;
                  }
                  paVar13 = paVar13->ai_next;
                  bVar17 = paVar13 == (addrinfo *)0x0;
                } while (!bVar17);
                iVar5 = 5;
              }
LAB_00107ccc:
              pcVar14 = local_b8;
              if (bVar17) {
                freeaddrinfo(local_d0);
                close(uVar6);
                iVar5 = 1;
              }
              if (iVar5 == 8) {
LAB_00107cfc:
                pfVar4 = fio_data;
                lVar16 = (ulong)uVar6 * 0xa8;
                LOCK();
                pcVar14 = (char *)((long)fio_data + lVar16 + 0x6c);
                cVar3 = *pcVar14;
                *pcVar14 = '\x01';
                UNLOCK();
                local_c8.tv_sec._0_1_ = cVar3;
                if (cVar3 != '\0') {
                  pcVar14 = (char *)((long)pfVar4 + lVar16 + 0x6c);
                  do {
                    local_c8.tv_sec = 0;
                    local_c8.tv_nsec = 1;
                    nanosleep(&local_c8,(timespec *)0x0);
                    LOCK();
                    cVar3 = *pcVar14;
                    *pcVar14 = '\x01';
                    UNLOCK();
                    local_c8.tv_sec._0_1_ = cVar3;
                  } while (cVar3 != '\0');
                }
                fio_clear_fd((ulong)uVar6,'\x01');
                LOCK();
                puVar1 = (undefined1 *)((long)fio_data + lVar16 + 0x6c);
                uVar2 = *puVar1;
                *puVar1 = 0;
                UNLOCK();
                local_c8.tv_sec = CONCAT71(local_c8.tv_sec._1_7_,uVar2);
                fio_tcp_addr_cpy(uVar6,local_d0->ai_family,(sockaddr *)local_d0);
                freeaddrinfo(local_d0);
                uVar15 = (ulong)CONCAT41(uVar6,*(undefined1 *)((long)fio_data + lVar16 + 0x6d));
                pcVar14 = local_b8;
              }
            }
            else {
              local_c8.tv_sec = CONCAT44(local_c8.tv_sec._4_4_,1);
              setsockopt(uVar6,1,2,&local_c8,4);
              if (local_d0 != (addrinfo *)0x0) {
                bVar17 = false;
                paVar13 = local_d0;
                do {
                  iVar5 = bind(uVar6,paVar13->ai_addr,paVar13->ai_addrlen);
                  if (iVar5 == 0) {
                    bVar17 = true;
                  }
                  paVar13 = paVar13->ai_next;
                } while (paVar13 != (addrinfo *)0x0);
                if (bVar17) {
                  local_c8.tv_sec = CONCAT44(local_c8.tv_sec._4_4_,0x80);
                  setsockopt(uVar6,local_d0->ai_protocol,0x17,&local_c8,4);
                  iVar5 = listen(uVar6,0x1000);
                  pcVar14 = local_b8;
                  if (iVar5 < 0) goto LAB_00107c13;
                  goto LAB_00107cfc;
                }
              }
              uVar15 = 0xffffffffffffffff;
              freeaddrinfo(local_d0);
              close(uVar6);
              pcVar14 = local_b8;
            }
          }
        }
      } while (*piVar11 == 4);
    }
  }
  return uVar15;
}

Assistant:

intptr_t fio_socket(const char *address, const char *port, uint8_t server) {
  intptr_t uuid;
  if (port) {
    char *pos = (char *)port;
    int64_t n = fio_atol(&pos);
    /* make sure port is only numerical */
    if (*pos) {
      FIO_LOG_ERROR("(fio_socket) port %s is not a number.", port);
      errno = EINVAL;
      return -1;
    }
    /* a negative port number will revert to a Unix socket. */
    if (n <= 0) {
      if (n < -1)
        FIO_LOG_WARNING("(fio_socket) negative port number %s is ignored.",
                        port);
      port = NULL;
    }
  }
  if (!address && !port) {
    FIO_LOG_ERROR("(fio_socket) both address and port are missing or invalid.");
    errno = EINVAL;
    return -1;
  }
  if (!port) {
    do {
      errno = 0;
      uuid = fio_unix_socket(address, server);
    } while (errno == EINTR);
  } else {
    do {
      errno = 0;
      uuid = fio_tcp_socket(address, port, server);
    } while (errno == EINTR);
  }
  return uuid;
}